

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_SET_OF.c
# Opt level: O0

int SET_OF_encode_xer_callback(void *buffer,size_t size,void *key)

{
  size_t __size;
  void *pvVar1;
  long *in_RDX;
  size_t in_RSI;
  void *in_RDI;
  void *p;
  size_t newsize;
  xer_tmp_enc_t *t;
  
  if ((ulong)in_RDX[2] <= in_RDX[1] + in_RSI) {
    __size = in_RDX[2] * 4 + in_RSI;
    pvVar1 = realloc((void *)*in_RDX,__size);
    if (pvVar1 == (void *)0x0) {
      return -1;
    }
    *in_RDX = (long)pvVar1;
    in_RDX[2] = __size;
  }
  memcpy((void *)(*in_RDX + in_RDX[1]),in_RDI,in_RSI);
  in_RDX[1] = in_RSI + in_RDX[1];
  return 0;
}

Assistant:

static int
SET_OF_encode_xer_callback(const void *buffer, size_t size, void *key) {
	xer_tmp_enc_t *t = (xer_tmp_enc_t *)key;
	if(t->offset + size >= t->size) {
		size_t newsize = (t->size << 2) + size;
		void *p = REALLOC(t->buffer, newsize);
		if(!p) return -1;
		t->buffer = p;
		t->size = newsize;
	}
	memcpy((char *)t->buffer + t->offset, buffer, size);
	t->offset += size;
	return 0;
}